

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O2

int oid_parse_number(uint *num,char **p,char *bound)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  *num = 0;
  pcVar2 = *p;
  uVar3 = 0;
  iVar1 = -0x68;
  while (((pcVar2 < bound && ((byte)(*pcVar2 - 0x30U) < 10)) && (iVar1 = -0x68, uVar3 < 0x1999999a))
        ) {
    *num = uVar3 * 10;
    uVar3 = ((int)*pcVar2 + uVar3 * 10) - 0x30;
    *num = uVar3;
    pcVar2 = pcVar2 + 1;
    *p = pcVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int oid_parse_number(unsigned int *num, const char **p, const char *bound)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;

    *num = 0;

    while (*p < bound && **p >= '0' && **p <= '9') {
        ret = 0;
        if (*num > (UINT_MAX / 10)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        *num *= 10;
        *num += **p - '0';
        (*p)++;
    }
    return ret;
}